

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool __thiscall
ON_Extrusion::GetBrepFormComponentIndex
          (ON_Extrusion *this,ON_COMPONENT_INDEX extrusion_ci,double extrusion_profile_parameter,
          ON_Brep *brep,bool bSmoothFaces,ON_COMPONENT_INDEX *brep_ci,ON_Interval *profile_subdomain
          )

{
  ON_COMPONENT_INDEX *this_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ON_Curve *pOVar6;
  undefined7 in_register_00000009;
  bool bVar7;
  uint extrusion_profile_index;
  int iVar8;
  int face_index;
  ON_Interval face_profile_domain;
  int local_68;
  undefined4 local_64;
  ON_COMPONENT_INDEX *local_60;
  ON_Interval *local_58;
  double local_50;
  ON_Interval local_48;
  ON_COMPONENT_INDEX local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000009,bSmoothFaces);
  local_50 = extrusion_profile_parameter;
  local_38 = extrusion_ci;
  ON_COMPONENT_INDEX::UnSet(brep_ci);
  local_68 = -1;
  ON_Interval::ON_Interval(&local_48,-1.23432101234321e+308,-1.23432101234321e+308);
  uVar2 = IsCapped(this);
  iVar3 = ProfileCount(this);
  if (iVar3 < 1) goto LAB_003ccad2;
  iVar4 = 0;
  local_58 = profile_subdomain;
  pOVar6 = Profile(this,0);
  if (pOVar6 == (ON_Curve *)0x0) goto LAB_003ccad4;
  iVar4 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(pOVar6);
  bVar1 = (byte)iVar4;
  iVar4 = 0;
  if ((iVar3 != 1 & (bVar1 ^ 1)) != 0) goto LAB_003ccad4;
  iVar8 = (uVar2 == 3) + 1;
  if (bVar1 == 0) {
    iVar8 = iVar4;
  }
  if (uVar2 == 0) {
    iVar8 = 0;
  }
  if (brep != (ON_Brep *)0x0) {
    iVar4 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  }
  local_60 = brep_ci;
  if ((brep != (ON_Brep *)0x0) && (iVar4 < iVar8 + iVar3)) {
    iVar4 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_beam.cpp"
               ,0xcf4,"","brep_form parameter cannot be extrusion\'s BrepForm()");
    goto LAB_003ccad4;
  }
  bVar7 = (bool)(iVar8 + iVar3 < iVar4 | (byte)local_64);
  iVar5 = iVar3;
  if (bVar7 == true) {
    local_64 = CONCAT31(local_64._1_3_,bVar1);
    iVar5 = GetSmoothSideCount(this);
    bVar1 = (byte)local_64;
  }
  extrusion_profile_index = local_38.m_index;
  switch(local_38.m_type) {
  case extrusion_bottom_profile:
  case extrusion_top_profile:
    if ((int)extrusion_profile_index < iVar3 && -1 < (long)local_38) {
      bVar7 = GetBrepFormFaceIndex(this,extrusion_profile_index,local_50,bVar7,&local_68,&local_48);
      iVar4 = 0;
      if (!bVar7) goto LAB_003ccad4;
      iVar3 = 0;
      if (0 < local_68) {
        iVar3 = local_68 * 3 + 1;
      }
      local_60->m_index = iVar3;
      if (local_38.m_type == extrusion_top_profile) {
        local_60->m_index = (local_60->m_index - (uint)(bVar1 & local_68 == iVar5 + -1)) + 2;
      }
      local_60->m_type = brep_edge;
LAB_003ccaa2:
      if (local_58 != (ON_Interval *)0x0) {
        local_58->m_t[0] = local_48.m_t[0];
        local_58->m_t[1] = local_48.m_t[1];
      }
      goto switchD_003cc91e_default;
    }
    break;
  case extrusion_wall_edge:
    if (((int)extrusion_profile_index < iVar3 * 2 && -1 < (long)local_38) &&
       (bVar7 = GetBrepFormFaceIndex
                          (this,extrusion_profile_index >> 1,local_50,bVar7,&local_68,&local_48),
       bVar7)) {
      local_60->m_index = local_68 * 4 + 1;
      local_60->m_type = brep_edge;
      goto switchD_003cc91e_default;
    }
    break;
  case extrusion_wall_surface:
    if (((int)extrusion_profile_index < iVar5 && -1 < (long)local_38) &&
       (bVar7 = GetBrepFormFaceIndex
                          (this,extrusion_profile_index,local_50,bVar7,&local_68,&local_48), bVar7))
    {
      local_60->m_index = local_68;
      local_60->m_type = brep_face;
      goto LAB_003ccaa2;
    }
    break;
  case extrusion_cap_surface:
    if ((((int)extrusion_profile_index < 3 && -1 < (long)local_38) &&
        (extrusion_profile_index != 1 || (uVar2 & 1) != 0)) &&
       (extrusion_profile_index != 2 || 0xfffffffd < (uVar2 | 0xfffffffc))) {
      if (brep == (ON_Brep *)0x0) {
        bVar7 = GetBrepFormFaceIndex(this,iVar3,local_50,bVar7,&local_68,&local_48);
        if (!bVar7) break;
      }
      else {
        local_68 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                   m_count - iVar8;
      }
      local_60->m_index = local_68 + extrusion_profile_index + -1;
      local_60->m_type = brep_face;
      goto switchD_003cc91e_default;
    }
    break;
  default:
switchD_003cc91e_default:
    this_00 = local_60;
    bVar7 = ON_COMPONENT_INDEX::IsBrepComponentIndex(local_60);
    iVar4 = 1;
    if (bVar7) goto LAB_003ccad4;
    ON_COMPONENT_INDEX::UnSet(this_00);
  }
LAB_003ccad2:
  iVar4 = 0;
LAB_003ccad4:
  return SUB41(iVar4,0);
}

Assistant:

bool ON_Extrusion::GetBrepFormComponentIndex(
  ON_COMPONENT_INDEX extrusion_ci,
  double extrusion_profile_parameter,
  const ON_Brep* brep,
  bool bSmoothFaces,
  ON_COMPONENT_INDEX& brep_ci,
  ON_Interval* profile_subdomain
) const
{
  brep_ci.UnSet();
  int face_index = -1;
  ON_Interval face_profile_domain(ON_UNSET_VALUE,ON_UNSET_VALUE);

  const int is_capped = IsCapped();
  if ( is_capped < 0 || is_capped > 3 )
    return false;
  const int profile_count = ProfileCount();
  if ( profile_count < 1 )
    return false;
  const ON_Curve* profile0 = Profile(0);
  if ( 0 == profile0 )
    return false;
  const bool bClosedProfile = profile0->IsClosed() ? true : false;
  if ( profile_count > 1 && !bClosedProfile )
    return false;
  const int edges_per_wall_face = 4;
  const int cap_count = (0 == is_capped || !bClosedProfile) ? 0 : ((3==is_capped)?2:1);
  int brep_face_count = ( nullptr != brep ) ? brep->m_F.Count() : 0;
  if ( nullptr != brep && brep_face_count < profile_count + cap_count )
  {
    ON_ERROR("brep_form parameter cannot be extrusion's BrepForm()");
    return false;
  }
  bool bCountProfileDiscontinuities = bSmoothFaces || ( brep_face_count > profile_count + cap_count );
  int side_count = (bCountProfileDiscontinuities) ? GetSmoothSideCount(*this) : profile_count;

  switch(extrusion_ci.m_type)
  {
  case ON_COMPONENT_INDEX::extrusion_bottom_profile:
  case ON_COMPONENT_INDEX::extrusion_top_profile:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= profile_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;

    // first face has edges_per_wall_face edges, the subsequent ones have one less
    if (face_index > 0)
      brep_ci.m_index = edges_per_wall_face + ((edges_per_wall_face-1) * (face_index-1));
    else
      brep_ci.m_index = 0;

    if (ON_COMPONENT_INDEX::extrusion_top_profile == extrusion_ci.m_type)
    {
      if ( bClosedProfile && face_index == side_count - 1)
        brep_ci.m_index += 1; // in closed case the last face has an already existing edge between bottom and top edge
      else
        brep_ci.m_index += 2;
    }
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_edge;
    if (nullptr != profile_subdomain)
      *profile_subdomain = face_profile_domain;
    break;

  case ON_COMPONENT_INDEX::extrusion_wall_edge:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= 2*profile_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index/2, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;
    brep_ci.m_index = edges_per_wall_face*face_index+1;
    if ( !bClosedProfile && 1 == (face_index % 1) )
      brep_ci.m_index += 2;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_edge;
    break;

  case ON_COMPONENT_INDEX::extrusion_wall_surface:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= side_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;
    brep_ci.m_index = face_index;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_face;
    if (nullptr != profile_subdomain)
      *profile_subdomain = face_profile_domain;
    break;

  case ON_COMPONENT_INDEX::extrusion_cap_surface:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index > 2 )
      return false;
    if ( 1 == extrusion_ci.m_index && (is_capped != 1 && is_capped != 3) )
      return false;
    if ( 2 == extrusion_ci.m_index && (is_capped != 2 && is_capped != 3) )
      return false;
    if ( 0 != brep )
    {
      face_index = brep->m_F.Count()-cap_count;
    }
    else if ( !GetBrepFormFaceIndex( *this, profile_count, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
    {
      return false;
    }

    brep_ci.m_index = face_index+extrusion_ci.m_index-1;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_face;
    break;

  case ON_COMPONENT_INDEX::extrusion_path:
    // There is no corresponding brep component index
    break;

  default:
    // Other ON_COMPONENT_INDEX::TYPE values intentionally ignored
    break;
  }

  if ( !brep_ci.IsBrepComponentIndex() )
  {
    brep_ci.UnSet();
    return false;
  }

  return true;
}